

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void libtorrent::dht::anon_unknown_0::put_data_cb
               (item *i,bool auth,shared_ptr<libtorrent::dht::put_data> *ta,
               function<void_(libtorrent::dht::item_&)> *f)

{
  pointer pcVar1;
  element_type *peVar2;
  long lVar3;
  undefined7 in_register_00000031;
  public_key *ppVar4;
  undefined8 *puVar5;
  byte bVar6;
  item copy;
  undefined1 auStack_e8 [40];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined8 local_a0 [12];
  sequence_number local_40;
  bool local_38;
  
  bVar6 = 0;
  if ((int)CONCAT71(in_register_00000031,auth) != 0) {
    entry::entry((entry *)auStack_e8,&i->m_value);
    pcVar1 = (i->m_salt)._M_dataplus._M_p;
    local_c0._M_p = (pointer)&local_b0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + (i->m_salt)._M_string_length);
    ppVar4 = &i->m_pk;
    puVar5 = local_a0;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *(undefined8 *)(ppVar4->bytes)._M_elems;
      ppVar4 = (public_key *)((long)ppVar4 + (ulong)bVar6 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_38 = i->m_mutable;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*f->_M_invoker)((_Any_data *)f,(item *)auStack_e8);
    peVar2 = (ta->super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    entry::operator=(&(peVar2->m_data).m_value,(entry *)auStack_e8);
    ::std::__cxx11::string::operator=((string *)&(peVar2->m_data).m_salt,(string *)&local_c0);
    puVar5 = local_a0;
    ppVar4 = &(peVar2->m_data).m_pk;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)(ppVar4->bytes)._M_elems = *puVar5;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      ppVar4 = (public_key *)((long)ppVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    (peVar2->m_data).m_seq.value = local_40.value;
    (peVar2->m_data).m_mutable = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    entry::~entry((entry *)auStack_e8);
  }
  return;
}

Assistant:

void put_data_cb(item const& i, bool auth
	, std::shared_ptr<put_data> const& ta
	, std::function<void(item&)> const& f)
{
	// call data_callback only when we got authoritative data.
	if (auth)
	{
		item copy(i);
		f(copy);
		ta->set_data(std::move(copy));
	}
}